

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int SaveEXRMultipartImageToFile
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,char *filename,char **err
              )

{
  FILE *__s;
  size_t __n;
  size_t sVar1;
  uchar *__ptr;
  string *msg;
  allocator local_71;
  uchar *mem;
  string local_50;
  
  if ((exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0) || num_parts < 2) {
    std::__cxx11::string::string
              ((string *)&local_50,"Invalid argument for SaveEXRMultipartImageToFile",
               (allocator *)&mem);
    tinyexr::SetErrorMessage(&local_50,err);
    std::__cxx11::string::~string((string *)&local_50);
    return -3;
  }
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    std::__cxx11::string::string((string *)&mem,filename,&local_71);
    std::operator+(&local_50,"Cannot write a file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mem);
    tinyexr::SetErrorMessage(&local_50,err);
    std::__cxx11::string::~string((string *)&local_50);
    msg = (string *)&mem;
  }
  else {
    mem = (uchar *)0x0;
    __n = SaveEXRMultipartImageToMemory(exr_images,exr_headers,num_parts,&mem,err);
    if (__n == 0) {
      return -0xc;
    }
    if (mem == (uchar *)0x0) {
      __ptr = (uchar *)0x0;
      sVar1 = 0;
    }
    else {
      sVar1 = fwrite(mem,1,__n,__s);
      __ptr = mem;
    }
    free(__ptr);
    fclose(__s);
    if (sVar1 == __n) {
      return 0;
    }
    msg = &local_50;
    std::__cxx11::string::string((string *)msg,"Cannot write a file",&local_71);
    tinyexr::SetErrorMessage(msg,err);
  }
  std::__cxx11::string::~string((string *)msg);
  return -0xb;
}

Assistant:

int SaveEXRMultipartImageToFile(const EXRImage* exr_images,
                                const EXRHeader** exr_headers,
                                unsigned int num_parts,
                                const char* filename,
                                const char** err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts < 2) {
    tinyexr::SetErrorMessage("Invalid argument for SaveEXRMultipartImageToFile",
                              err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || (defined(MINGW_HAS_SECURE_API) && MINGW_HAS_SECURE_API) // MSVC, MinGW GCC, or Clang.
  errno_t errcode =
    _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"wb");
  if (errcode != 0) {
    tinyexr::SetErrorMessage("Cannot write a file: " + std::string(filename),
                             err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }
#else
  // Unknown compiler or MinGW without MINGW_HAS_SECURE_API.
  fp = fopen(filename, "wb");
#endif
#else
  fp = fopen(filename, "wb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot write a file: " + std::string(filename),
                             err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  unsigned char *mem = NULL;
  size_t mem_size = SaveEXRMultipartImageToMemory(exr_images, exr_headers, num_parts, &mem, err);
  if (mem_size == 0) {
    return TINYEXR_ERROR_SERIALIZATION_FAILED;
  }

  size_t written_size = 0;
  if ((mem_size > 0) && mem) {
    written_size = fwrite(mem, 1, mem_size, fp);
  }
  free(mem);

  fclose(fp);

  if (written_size != mem_size) {
    tinyexr::SetErrorMessage("Cannot write a file", err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  return TINYEXR_SUCCESS;
}